

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_HasIndex_Test<unsigned_long>::SparseArray_HasIndex_Test
          (SparseArray_HasIndex_Test<unsigned_long> *this)

{
  SparseArray_HasIndex_Test<unsigned_long> *this_local;
  
  anon_unknown.dwarf_92f3e::SparseArray<unsigned_long>::SparseArray
            (&this->super_SparseArray<unsigned_long>);
  (this->super_SparseArray<unsigned_long>).super_Test._vptr_Test =
       (_func_int **)&PTR__SparseArray_HasIndex_Test_00353db0;
  return;
}

Assistant:

TYPED_TEST (SparseArray, HasIndex) {
    std::set<std::size_t> indices{2, 3, 5, 7};
    auto arr =
        sparse_array<int, TypeParam>::make_unique (std::begin (indices), std::end (indices), {});
    EXPECT_EQ (arr->has_index (0), indices.find (0) != indices.end ());
    EXPECT_EQ (arr->has_index (1), indices.find (1) != indices.end ());
    EXPECT_EQ (arr->has_index (2), indices.find (2) != indices.end ());
    EXPECT_EQ (arr->has_index (3), indices.find (3) != indices.end ());
    EXPECT_EQ (arr->has_index (4), indices.find (4) != indices.end ());
    EXPECT_EQ (arr->has_index (5), indices.find (5) != indices.end ());
    EXPECT_EQ (arr->has_index (6), indices.find (6) != indices.end ());
    EXPECT_EQ (arr->has_index (7), indices.find (7) != indices.end ());
}